

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void R_DrawSkyPlane(visplane_t *pl)

{
  uint uVar1;
  side_t *psVar2;
  unsigned_short *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  lighttable_t *plVar7;
  FTexture *pFVar8;
  float fVar9;
  line_t *plVar10;
  FTextureID FVar11;
  FTextureID FVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  short sVar18;
  unsigned_short uVar19;
  code *pcVar20;
  ushort uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  int iVar26;
  double __y;
  undefined1 auVar25 [16];
  double dVar27;
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  short bot [5760];
  short top [5760];
  double local_5a68;
  unsigned_short local_5a38 [5760];
  short local_2d38 [5764];
  
  plVar10 = lines;
  uVar22 = (ulong)sky2texture.texnum;
  FVar11.texnum = sky2texture.texnum;
  if ((level.flags & 0x10000004) != 0x10000000) {
    FVar11.texnum = sky1texture.texnum;
  }
  skymid = skytexturemid;
  skyangle = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
  if ((pl->picnum).texnum != skyflatnum.texnum) {
    dVar23 = 0.0;
    local_5a68 = 0.0;
    goto LAB_0030aaee;
  }
  uVar1 = pl->sky;
  if ((uVar1 >> 0x1e & 1) != 0) {
    if (uVar1 == 0x40000000) {
      if (uVar22 < TexMan.Textures.Count) {
        FVar11 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[uVar22]);
        frontskytex = TexMan.Textures.Array[FVar11.texnum].Texture;
      }
      else {
        frontskytex = (FTexture *)0x0;
      }
      backskytex = (FTexture *)0x0;
      frontcyl = sky2cyl;
      skyflip = 0;
      local_5a68 = 0.0;
      dVar23 = sky2pos;
      goto LAB_0030aaee;
    }
    psVar2 = lines[((long)(int)uVar1 & 0x1fffffffbfffffffU) - 1].sidedef[0];
    if ((level.flags >> 0x1c & 1) == 0) {
LAB_0030a97f:
      iVar14 = psVar2->textures[0].texture.texnum;
      iVar26 = 0;
    }
    else {
      iVar14 = psVar2->textures[2].texture.texnum;
      iVar26 = 2;
      if (iVar14 < 1) goto LAB_0030a97f;
    }
    if ((ulong)(long)iVar14 < (ulong)TexMan.Textures.Count) {
      FVar12 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[iVar14]);
      frontskytex = TexMan.Textures.Array[FVar12.texnum].Texture;
      if ((frontskytex != (FTexture *)0x0) && (frontskytex->UseType != '\r')) {
        backskytex = (FTexture *)0x0;
        skyangle = skyangle +
                   SUB84(*(double *)
                          ((long)&psVar2->textures[0].xOffset + (ulong)(uint)(iVar26 * 0x30)) +
                         103079215104.0,0);
        skymid = *(double *)((long)&psVar2->textures[0].yOffset + (ulong)(uint)(iVar26 * 0x30)) +
                 -28.0;
        skyflip = -(uint)(plVar10[((long)(int)uVar1 & 0x1fffffffbfffffffU) - 1].args[2] == 0);
        frontcyl = (fixed_t)((frontskytex->Scale).X * 1024.0);
        if (frontcyl < (int)(uint)frontskytex->Width) {
          frontcyl = (uint)frontskytex->Width;
        }
        local_5a68 = 0.0;
        if (skystretch == true) {
          skymid = (skymid * 0.0043859649122807015 * (double)frontskytex->Height) /
                   (frontskytex->Scale).Y;
        }
        dVar23 = 0.0;
        goto LAB_0030aaee;
      }
    }
    else {
      frontskytex = (FTexture *)0x0;
    }
  }
  if ((ulong)(long)FVar11.texnum < (ulong)TexMan.Textures.Count) {
    FVar11 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[FVar11.texnum]);
    frontskytex = TexMan.Textures.Array[FVar11.texnum].Texture;
  }
  else {
    frontskytex = (FTexture *)0x0;
  }
  if (((level.flags & 4) == 0) || (TexMan.Textures.Count <= uVar22)) {
    backskytex = (FTexture *)0x0;
  }
  else {
    FVar11 = FTextureManager::PalCheck(&TexMan,TexMan.Translation.Array[uVar22]);
    backskytex = TexMan.Textures.Array[FVar11.texnum].Texture;
  }
  skyflip = 0;
  local_5a68 = sky2pos;
  frontcyl = sky1cyl;
  backcyl = sky2cyl;
  dVar23 = sky1pos;
LAB_0030aaee:
  pFVar8 = backskytex;
  dVar23 = fmod(dVar23,(double)sky1cyl * 65536.0);
  frontpos = (int)dVar23;
  if (pFVar8 != (FTexture *)0x0) {
    dVar23 = fmod(local_5a68,(double)sky2cyl * 65536.0);
    backpos = (int)dVar23;
  }
  fVar9 = skyiscale;
  plVar7 = fixedcolormap;
  auVar6 = _DAT_0073c1a0;
  auVar5 = _DAT_0073b300;
  auVar4 = _DAT_0073b2f0;
  if (fixedcolormap == (lighttable_t *)0x0) {
    fixedcolormap = NormalLight.Maps;
  }
  iVar14 = pl->left;
  lVar13 = (long)iVar14;
  dc_colormap = fixedcolormap;
  if (iVar14 < pl->right) {
    lVar16 = pl->right - lVar13;
    lVar17 = lVar16 + -1;
    auVar25._8_4_ = (int)lVar17;
    auVar25._0_8_ = lVar17;
    auVar25._12_4_ = (int)((ulong)lVar17 >> 0x20);
    lVar17 = lVar13 * 4;
    uVar22 = 0;
    auVar25 = auVar25 ^ _DAT_0073b300;
    do {
      auVar28._8_4_ = (int)uVar22;
      auVar28._0_8_ = uVar22;
      auVar28._12_4_ = (int)(uVar22 >> 0x20);
      auVar29 = (auVar28 | auVar4) ^ auVar5;
      iVar26 = auVar25._4_4_;
      if ((bool)(~(auVar29._4_4_ == iVar26 && auVar25._0_4_ < auVar29._0_4_ ||
                  iVar26 < auVar29._4_4_) & 1)) {
        swall[lVar13 + uVar22] = fVar9;
      }
      if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
          auVar29._12_4_ <= auVar25._12_4_) {
        *(float *)(lVar17 + 0x90e164 + uVar22 * 4) = fVar9;
      }
      auVar28 = (auVar28 | auVar6) ^ auVar5;
      iVar30 = auVar28._4_4_;
      if (iVar30 <= iVar26 && (iVar30 != iVar26 || auVar28._0_4_ <= auVar25._0_4_)) {
        *(float *)(lVar17 + 0x90e168 + uVar22 * 4) = fVar9;
        *(float *)(lVar17 + 0x90e16c + uVar22 * 4) = fVar9;
      }
      uVar22 = uVar22 + 4;
    } while ((lVar16 + 3U & 0xfffffffffffffffc) != uVar22);
    if (((byte)MirrorFlags & 1) == 0) {
      iVar14 = iVar14 << 0x10;
      do {
        lwall[lVar13] = iVar14;
        lVar13 = lVar13 + 1;
        iVar26 = pl->right;
        iVar14 = iVar14 + 0x10000;
      } while (lVar13 < iVar26);
    }
    else {
      iVar14 = viewwidth * 0x10000 + iVar14 * -0x10000;
      do {
        lwall[lVar13] = iVar14;
        lVar13 = lVar13 + 1;
        iVar26 = pl->right;
        iVar14 = iVar14 + -0x10000;
      } while (lVar13 < iVar26);
    }
    lastskycol[0] = 0xffffffff;
    lastskycol[1] = 0xffffffff;
    lastskycol[2] = 0xffffffff;
    lastskycol[3] = 0xffffffff;
    rw_pic = frontskytex;
    rw_offset = 0;
    dVar23 = (frontskytex->Scale).Y;
    dc_texturemid = skymid * dVar23;
    if (1 << (frontskytex->HeightBits & 0x1f) == (uint)frontskytex->Height) {
      pcVar20 = R_GetTwoSkyColumns;
      if (pFVar8 == (FTexture *)0x0) {
        pcVar20 = R_GetOneSkyColumn;
      }
      wallscan(pl->left,iVar26,(short *)&pl->field_0xda,(short *)pl->bottom,swall,lwall,dVar23,
               pcVar20);
    }
    else {
      dVar23 = dVar23 * skyscale;
      __y = (double)frontskytex->Height;
      dVar27 = (1.0 - CenterY) * (1.0 / dVar23);
      dVar24 = fmod(skymid + dVar27,__y);
      dVar24 = (double)(-(ulong)(dVar24 < 0.0) & (ulong)__y) + dVar24;
      dc_texturemid = dVar24 - dVar27;
      if (0 < viewheight) {
        iVar14 = (int)((__y - dVar24) * dVar23);
        iVar26 = 0;
        do {
          iVar15 = iVar14;
          iVar14 = pl->left;
          lVar13 = (long)iVar14;
          iVar30 = pl->right;
          uVar21 = (ushort)iVar15;
          if (iVar14 < iVar30) {
            puVar3 = pl->bottom;
            do {
              sVar18 = *(short *)(&pl->field_0xda + lVar13 * 2);
              if (*(short *)(&pl->field_0xda + lVar13 * 2) < (short)iVar26) {
                sVar18 = (short)iVar26;
              }
              local_2d38[lVar13] = sVar18;
              uVar19 = puVar3[lVar13];
              if ((short)uVar21 < (short)puVar3[lVar13]) {
                uVar19 = uVar21;
              }
              local_5a38[lVar13] = uVar19;
              lVar13 = lVar13 + 1;
            } while (iVar30 != lVar13);
          }
          lastskycol[0] = 0xffffffff;
          lastskycol[1] = 0xffffffff;
          lastskycol[2] = 0xffffffff;
          lastskycol[3] = 0xffffffff;
          pcVar20 = R_GetTwoSkyColumns;
          if (backskytex == (FTexture *)0x0) {
            pcVar20 = R_GetOneSkyColumn;
          }
          wallscan(iVar14,iVar30,local_2d38,(short *)local_5a38,swall,lwall,(rw_pic->Scale).Y,
                   pcVar20);
          dc_texturemid = (double)((short)~uVar21 + centery) * (1.0 / dVar23);
          iVar14 = iVar15 + (int)(dVar23 * __y);
          iVar26 = iVar15;
        } while ((short)uVar21 < viewheight);
      }
    }
  }
  if (plVar7 == (lighttable_t *)0x0) {
    fixedcolormap = (lighttable_t *)0x0;
  }
  return;
}

Assistant:

void R_DrawSkyPlane (visplane_t *pl)
{
	FTextureID sky1tex, sky2tex;
	double frontdpos = 0, backdpos = 0;

	if ((level.flags & LEVEL_SWAPSKIES) && !(level.flags & LEVEL_DOUBLESKY))
	{
		sky1tex = sky2texture;
	}
	else
	{
		sky1tex = sky1texture;
	}
	sky2tex = sky2texture;
	skymid = skytexturemid;
	skyangle = ViewAngle.BAMs();

	if (pl->picnum == skyflatnum)
	{
		if (!(pl->sky & PL_SKYFLAT))
		{	// use sky1
		sky1:
			frontskytex = TexMan(sky1tex, true);
			if (level.flags & LEVEL_DOUBLESKY)
				backskytex = TexMan(sky2tex, true);
			else
				backskytex = NULL;
			skyflip = 0;
			frontdpos = sky1pos;
			backdpos = sky2pos;
			frontcyl = sky1cyl;
			backcyl = sky2cyl;
		}
		else if (pl->sky == PL_SKYFLAT)
		{	// use sky2
			frontskytex = TexMan(sky2tex, true);
			backskytex = NULL;
			frontcyl = sky2cyl;
			skyflip = 0;
			frontdpos = sky2pos;
		}
		else
		{	// MBF's linedef-controlled skies
			// Sky Linedef
			const line_t *l = &lines[(pl->sky & ~PL_SKYFLAT)-1];

			// Sky transferred from first sidedef
			const side_t *s = l->sidedef[0];
			int pos;

			// Texture comes from upper texture of reference sidedef
			// [RH] If swapping skies, then use the lower sidedef
			if (level.flags & LEVEL_SWAPSKIES && s->GetTexture(side_t::bottom).isValid())
			{
				pos = side_t::bottom;
			}
			else
			{
				pos = side_t::top;
			}

			frontskytex = TexMan(s->GetTexture(pos), true);
			if (frontskytex == NULL || frontskytex->UseType == FTexture::TEX_Null)
			{ // [RH] The blank texture: Use normal sky instead.
				goto sky1;
			}
			backskytex = NULL;

			// Horizontal offset is turned into an angle offset,
			// to allow sky rotation as well as careful positioning.
			// However, the offset is scaled very small, so that it
			// allows a long-period of sky rotation.
			skyangle += FLOAT2FIXED(s->GetTextureXOffset(pos));

			// Vertical offset allows careful sky positioning.
			skymid = s->GetTextureYOffset(pos) - 28;

			// We sometimes flip the picture horizontally.
			//
			// Doom always flipped the picture, so we make it optional,
			// to make it easier to use the new feature, while to still
			// allow old sky textures to be used.
			skyflip = l->args[2] ? 0u : ~0u;

			int frontxscale = int(frontskytex->Scale.X * 1024);
			frontcyl = MAX(frontskytex->GetWidth(), frontxscale);
			if (skystretch)
			{
				skymid = skymid * frontskytex->GetScaledHeightDouble() / SKYSTRETCH_HEIGHT;
			}
		}
	}
	frontpos = int(fmod(frontdpos, sky1cyl * 65536.0));
	if (backskytex != NULL)
	{
		backpos = int(fmod(backdpos, sky2cyl * 65536.0));
	}

	bool fakefixed = false;
	if (fixedcolormap)
	{
		dc_colormap = fixedcolormap;
	}
	else
	{
		fakefixed = true;
		fixedcolormap = dc_colormap = NormalLight.Maps;
	}

	R_DrawSky (pl);

	if (fakefixed)
		fixedcolormap = NULL;
}